

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportFileGenerator::PopulateCxxModuleExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          PreprocessContext ctx,string *includesDestinationDirs,string *errorMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  cmTarget *pcVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  cmMakefile *pcVar7;
  cmValue cVar8;
  mapped_type *pmVar9;
  long lVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string value;
  string exportedPropName;
  string propNameStr_1;
  ModulePropertyTable exportedModuleProperties [4];
  string local_118;
  char *local_f8;
  undefined8 local_f0;
  string local_e8;
  string local_c8;
  cmExportFileGenerator *local_a8;
  string *local_a0;
  string local_98;
  char *local_78;
  undefined4 local_70;
  undefined8 local_68;
  char *local_60;
  undefined4 local_58;
  undefined8 local_50;
  char *local_48;
  undefined4 local_40;
  
  local_a8 = this;
  local_a0 = includesDestinationDirs;
  bVar6 = cmGeneratorTarget::HaveCxx20ModuleSources(gte,errorMessage);
  if (bVar6) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CXX_EXTENSIONS","");
    pcVar3 = gte->Target;
    pcVar7 = cmTarget::GetMakefile(pcVar3);
    cVar8 = cmTarget::GetComputedProperty(pcVar3,&local_98,pcVar7);
    if (cVar8.Value == (string *)0x0) {
      cVar8 = cmTarget::GetProperty(gte->Target,&local_98);
    }
    if (cVar8.Value != (string *)0x0) {
      cmGeneratorExpression::Preprocess(&local_118,cVar8.Value,ctx,false);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,&local_98);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                               local_98.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_98._M_dataplus._M_p = (pointer)0x13;
    local_98._M_string_length = 0x7e1fd5;
    local_98.field_2._M_allocated_capacity._0_4_ = 2;
    local_98.field_2._8_8_ = 0x13;
    local_78 = "COMPILE_DEFINITIONS";
    local_70 = 0;
    local_68 = 0xf;
    local_60 = "COMPILE_OPTIONS";
    local_58 = 0;
    local_50 = 0x10;
    local_48 = "COMPILE_FEATURES";
    local_40 = 0;
    paVar1 = &local_c8.field_2;
    lVar10 = 0x10;
    do {
      lVar4 = *(long *)((long)&local_a8 + lVar10);
      pcVar5 = *(char **)((long)&local_a0 + lVar10);
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar5,pcVar5 + lVar4);
      pcVar3 = gte->Target;
      pcVar7 = cmTarget::GetMakefile(pcVar3);
      cVar8 = cmTarget::GetComputedProperty(pcVar3,&local_c8,pcVar7);
      if (cVar8.Value == (string *)0x0) {
        cVar8 = cmTarget::GetProperty(gte->Target,&local_c8);
      }
      if (cVar8.Value != (string *)0x0) {
        local_118._M_dataplus._M_p = (pointer)0x15;
        local_118._M_string_length = 0x823ee0;
        local_118.field_2._M_allocated_capacity = 0;
        local_f0 = 0;
        views._M_len = 2;
        views._M_array = (iterator)&local_118;
        local_118.field_2._8_8_ = lVar4;
        local_f8 = pcVar5;
        cmCatViews(&local_e8,views);
        cmGeneratorExpression::Preprocess(&local_118,cVar8.Value,ctx,false);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_e8);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((ctx == InstallInterface) &&
           (iVar2 = *(int *)((long)&local_98._M_dataplus._M_p + lVar10), iVar2 - 1U < 2)) {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&local_e8);
          (*local_a8->_vptr_cmExportFileGenerator[0x14])(local_a8,pmVar9);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&local_e8);
          prefixItems(pmVar9);
          if ((iVar2 == 2) && (local_a0->_M_string_length != 0)) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&local_e8);
            if (pmVar9->_M_string_length != 0) {
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](properties,&local_e8);
              std::__cxx11::string::push_back((char)pmVar9);
            }
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&local_e8);
            std::__cxx11::string::_M_append((char *)pmVar9,(ulong)(local_a0->_M_dataplus)._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x70);
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"LINK_LIBRARIES","");
    pcVar3 = gte->Target;
    pcVar7 = cmTarget::GetMakefile(pcVar3);
    cVar8 = cmTarget::GetComputedProperty(pcVar3,&local_c8,pcVar7);
    if (cVar8.Value == (string *)0x0) {
      cVar8 = cmTarget::GetProperty(gte->Target,&local_c8);
    }
    if (cVar8.Value != (string *)0x0) {
      local_118._M_dataplus._M_p = (pointer)0x15;
      local_118._M_string_length = 0x823ee0;
      local_118.field_2._M_allocated_capacity = 0;
      local_118.field_2._8_8_ = 0xe;
      local_f8 = "LINK_LIBRARIES";
      local_f0 = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_118;
      cmCatViews(&local_e8,views_00);
      cmGeneratorExpression::Preprocess(&local_118,cVar8.Value,ctx,false);
      ResolveTargetsInGeneratorExpressions(local_a8,&local_118,gte,ReplaceFreeTargets);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,&local_e8);
      std::__cxx11::string::_M_assign((string *)pmVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool cmExportFileGenerator::PopulateCxxModuleExportProperties(
  cmGeneratorTarget const* gte, ImportPropertyMap& properties,
  cmGeneratorExpression::PreprocessContext ctx,
  std::string const& includesDestinationDirs, std::string& errorMessage)
{
  if (!gte->HaveCxx20ModuleSources(&errorMessage)) {
    return true;
  }

  const cm::static_string_view exportedDirectModuleProperties[] = {
    "CXX_EXTENSIONS"_s,
  };
  for (auto const& propName : exportedDirectModuleProperties) {
    auto const propNameStr = std::string(propName);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      properties[propNameStr] = cmGeneratorExpression::Preprocess(*prop, ctx);
    }
  }

  const ModulePropertyTable exportedModuleProperties[] = {
    { "INCLUDE_DIRECTORIES"_s, PropertyType::IncludePaths },
    { "COMPILE_DEFINITIONS"_s, PropertyType::Strings },
    { "COMPILE_OPTIONS"_s, PropertyType::Strings },
    { "COMPILE_FEATURES"_s, PropertyType::Strings },
  };
  for (auto const& propEntry : exportedModuleProperties) {
    auto const propNameStr = std::string(propEntry.Name);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      auto const exportedPropName =
        cmStrCat("IMPORTED_CXX_MODULES_", propEntry.Name);
      properties[exportedPropName] =
        cmGeneratorExpression::Preprocess(*prop, ctx);
      if (ctx == cmGeneratorExpression::InstallInterface &&
          PropertyTypeIsForPaths(propEntry.Type)) {
        this->ReplaceInstallPrefix(properties[exportedPropName]);
        prefixItems(properties[exportedPropName]);
        if (propEntry.Type == PropertyType::IncludePaths &&
            !includesDestinationDirs.empty()) {
          if (!properties[exportedPropName].empty()) {
            properties[exportedPropName] += ';';
          }
          properties[exportedPropName] += includesDestinationDirs;
        }
      }
    }
  }

  const cm::static_string_view exportedLinkModuleProperties[] = {
    "LINK_LIBRARIES"_s,
  };
  for (auto const& propName : exportedLinkModuleProperties) {
    auto const propNameStr = std::string(propName);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      auto const exportedPropName =
        cmStrCat("IMPORTED_CXX_MODULES_", propName);
      auto value = cmGeneratorExpression::Preprocess(*prop, ctx);
      this->ResolveTargetsInGeneratorExpressions(
        value, gte, cmExportFileGenerator::ReplaceFreeTargets);
      properties[exportedPropName] = value;
    }
  }

  return true;
}